

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QString * absoluteFilePath(Options *options,QString *relativeFileName)

{
  bool bVar1;
  ulong uVar2;
  QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>
  *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QStringBuilder<const_QString_&,_char16_t> QVar4;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QString *dir_1;
  vector<QString,_std::allocator<QString>_> *__range2_1;
  QString *prefix;
  vector<QString,_std::allocator<QString>_> *__range1;
  QString *dir;
  vector<QString,_std::allocator<QString>_> *__range2;
  QString *path;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator __end2;
  const_iterator __begin2;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_QString>
  *in_stack_fffffffffffffbe8;
  QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>
  *in_stack_fffffffffffffbf0;
  QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>
  *a;
  QStringBuilder<const_QString_&,_char16_t> *in_stack_fffffffffffffbf8;
  QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>
  *a_00;
  char *local_3c8;
  char *local_3b8;
  char *local_390;
  char *local_350;
  undefined1 local_310 [30];
  undefined2 local_2f2;
  QString *local_2f0;
  char16_t local_2e8;
  undefined2 local_2dc;
  undefined2 local_2da;
  QString *local_2d8;
  char16_t local_2d0;
  undefined2 local_2c4;
  undefined2 local_2c2;
  QString *local_2c0;
  char16_t local_2b8;
  undefined2 local_2aa;
  QString *local_2a8;
  char16_t local_2a0;
  undefined2 local_292;
  QString *local_290;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_> local_288;
  QString *local_280;
  char16_t local_278;
  undefined2 local_26a;
  QString *local_268;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_> local_260;
  undefined1 local_258 [24];
  QString *local_240;
  char16_t local_238;
  undefined2 local_22a;
  QString *local_228;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_> local_220;
  QString *local_218;
  char16_t local_210;
  QString *local_1f0;
  char16_t local_1e8;
  QString *local_170;
  char16_t local_168;
  QString *local_100;
  char16_t local_f8;
  QString *local_90;
  char16_t local_88;
  QString *local_68;
  char16_t local_60;
  QString *local_40;
  char16_t local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0);
  local_350 = (char *)QVar3.m_size;
  QVar5.m_data = local_350;
  QVar5.m_size = (qsizetype)in_RDX;
  uVar2 = QString::startsWith(QVar5,(CaseSensitivity)QVar3.m_data);
  if ((uVar2 & 1) != 0) {
    local_220._M_current = (QString *)0xaaaaaaaaaaaaaaaa;
    local_220._M_current =
         (QString *)
         std::vector<QString,_std::allocator<QString>_>::begin
                   ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffbf0);
    local_228 = (QString *)0xaaaaaaaaaaaaaaaa;
    local_228 = (QString *)
                std::vector<QString,_std::allocator<QString>_>::end
                          ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffbf0);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                               *)in_stack_fffffffffffffbf0,
                              (__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                               *)in_stack_fffffffffffffbe8), bVar1) {
      __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
      ::operator*(&local_220);
      (in_RDI->d).size = -0x5555555555555556;
      (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
      (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_22a = 0x2f;
      QVar4 = operator+((QString *)in_stack_fffffffffffffbf8,(char16_t *)in_stack_fffffffffffffbf0);
      local_240 = QVar4.a;
      local_238 = QVar4.b;
      local_40 = local_240;
      local_38 = local_238;
      QString::mid((longlong)local_258,(longlong)in_RDX);
      operator+(in_stack_fffffffffffffbf8,(QString *)in_stack_fffffffffffffbf0);
      QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> *)
                 in_stack_fffffffffffffbe8);
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> *)0x1204cc);
      QString::~QString((QString *)0x1204d9);
      uVar2 = QFile::exists((QString *)in_RDI);
      if ((uVar2 & 1) != 0) goto LAB_00120ce6;
      QString::~QString((QString *)0x12051d);
      __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
      ::operator++(&local_220);
    }
  }
  local_260._M_current = (QString *)0xaaaaaaaaaaaaaaaa;
  local_260._M_current =
       (QString *)
       std::vector<QString,_std::allocator<QString>_>::begin
                 ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffbf0);
  local_268 = (QString *)0xaaaaaaaaaaaaaaaa;
  local_268 = (QString *)
              std::vector<QString,_std::allocator<QString>_>::end
                        ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffbf0);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                             *)in_stack_fffffffffffffbf0,
                            (__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                             *)in_stack_fffffffffffffbe8), bVar1) {
    __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
    operator*(&local_260);
    (in_RDI->d).size = -0x5555555555555556;
    (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_26a = 0x2f;
    QVar4 = operator+((QString *)in_stack_fffffffffffffbf8,(char16_t *)in_stack_fffffffffffffbf0);
    local_280 = QVar4.a;
    local_278 = QVar4.b;
    local_68 = local_280;
    local_60 = local_278;
    operator+((QStringBuilder<const_QString_&,_char16_t> *)in_stack_fffffffffffffbf0,
              (QString *)in_stack_fffffffffffffbe8);
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
               in_stack_fffffffffffffbe8);
    uVar2 = QFile::exists((QString *)in_RDI);
    if ((uVar2 & 1) != 0) goto LAB_00120ce6;
    QString::~QString((QString *)0x1206e4);
    __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
    operator++(&local_260);
  }
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0);
  local_390 = (char *)QVar3.m_size;
  QVar6.m_data = local_390;
  QVar6.m_size = (qsizetype)in_RDX;
  uVar2 = QString::endsWith(QVar6,(CaseSensitivity)QVar3.m_data);
  if ((uVar2 & 1) == 0) {
    a_00 = in_RDX;
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDX,(size_t)in_stack_fffffffffffffbf0);
    local_3b8 = (char *)QVar3.m_size;
    QVar7.m_data = local_3b8;
    QVar7.m_size = (qsizetype)a_00;
    uVar2 = QString::startsWith(QVar7,(CaseSensitivity)QVar3.m_data);
    if ((uVar2 & 1) == 0) {
      a = in_RDX;
      QVar3 = Qt::Literals::StringLiterals::operator____L1((char *)a_00,(size_t)in_RDX);
      local_3c8 = (char *)QVar3.m_size;
      QVar8.m_data = local_3c8;
      QVar8.m_size = (qsizetype)a;
      uVar2 = QString::startsWith(QVar8,(CaseSensitivity)QVar3.m_data);
      if ((uVar2 & 1) == 0) {
        QVar4 = operator+((QString *)a_00,(char16_t *)a);
        local_218 = QVar4.a;
        local_210 = QVar4.b;
        operator+((QStringBuilder<const_QString_&,_char16_t> *)a,
                  (QString *)in_stack_fffffffffffffbe8);
        QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
                   in_stack_fffffffffffffbe8);
      }
      else {
        local_2dc = 0x2f;
        QVar4 = operator+((QString *)a_00,(char16_t *)a);
        local_2f0 = QVar4.a;
        local_2e8 = QVar4.b;
        local_1f0 = local_2f0;
        local_1e8 = local_2e8;
        operator+((QStringBuilder<const_QString_&,_char16_t> *)a,
                  (QString *)in_stack_fffffffffffffbe8);
        local_2f2 = 0x2f;
        operator+(&a->a,(char16_t *)in_stack_fffffffffffffbe8);
        QString::mid((longlong)local_310,(longlong)in_RDX);
        operator+(a_00,(QString *)a);
        QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffbe8);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_QString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_QString>
                           *)0x120c4f);
        QString::~QString((QString *)0x120c5c);
      }
    }
    else {
      local_2c4 = 0x2f;
      QVar4 = operator+((QString *)a_00,(char16_t *)in_stack_fffffffffffffbf0);
      local_2d8 = QVar4.a;
      local_2d0 = QVar4.b;
      local_170 = local_2d8;
      local_168 = local_2d0;
      operator+((QStringBuilder<const_QString_&,_char16_t> *)in_stack_fffffffffffffbf0,
                (QString *)in_stack_fffffffffffffbe8);
      local_2da = 0x2f;
      operator+(&in_stack_fffffffffffffbf0->a,(char16_t *)in_stack_fffffffffffffbe8);
      operator+(in_stack_fffffffffffffbf0,(QString *)in_stack_fffffffffffffbe8);
      QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>
                  *)in_stack_fffffffffffffbe8);
    }
  }
  else {
    local_288._M_current = (QString *)0xaaaaaaaaaaaaaaaa;
    local_288._M_current =
         (QString *)
         std::vector<QString,_std::allocator<QString>_>::begin
                   ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffbf0);
    local_290 = (QString *)0xaaaaaaaaaaaaaaaa;
    local_290 = (QString *)
                std::vector<QString,_std::allocator<QString>_>::end
                          ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffbf0);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                               *)in_stack_fffffffffffffbf0,
                              (__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                               *)in_stack_fffffffffffffbe8), bVar1) {
      __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
      ::operator*(&local_288);
      (in_RDI->d).size = -0x5555555555555556;
      (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
      (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_292 = 0x2f;
      QVar4 = operator+((QString *)in_stack_fffffffffffffbf8,(char16_t *)in_stack_fffffffffffffbf0);
      local_2a8 = QVar4.a;
      local_2a0 = QVar4.b;
      local_90 = local_2a8;
      local_88 = local_2a0;
      operator+((QStringBuilder<const_QString_&,_char16_t> *)in_stack_fffffffffffffbf0,
                (QString *)in_stack_fffffffffffffbe8);
      QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
                 in_stack_fffffffffffffbe8);
      uVar2 = QFile::exists((QString *)in_RDI);
      if ((uVar2 & 1) != 0) goto LAB_00120ce6;
      QString::~QString((QString *)0x1208ed);
      __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
      ::operator++(&local_288);
    }
    local_2aa = 0x2f;
    QVar4 = operator+((QString *)in_stack_fffffffffffffbf8,(char16_t *)in_stack_fffffffffffffbf0);
    local_2c0 = QVar4.a;
    local_2b8 = QVar4.b;
    local_100 = local_2c0;
    local_f8 = local_2b8;
    operator+((QStringBuilder<const_QString_&,_char16_t> *)in_stack_fffffffffffffbf0,
              (QString *)in_stack_fffffffffffffbe8);
    local_2c2 = 0x2f;
    operator+(&in_stack_fffffffffffffbf0->a,(char16_t *)in_stack_fffffffffffffbe8);
    operator+(in_stack_fffffffffffffbf0,(QString *)in_stack_fffffffffffffbe8);
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>
                *)in_stack_fffffffffffffbe8);
  }
LAB_00120ce6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString absoluteFilePath(const Options *options, const QString &relativeFileName)
{
    // Use extraLibraryDirs as the extra library lookup folder if it is expected to find a file in
    // any $prefix/lib folder.
    // Library directories from a build tree(extraLibraryDirs) have the higher priority.
    if (relativeFileName.startsWith("lib/"_L1)) {
        for (const auto &dir : options->extraLibraryDirs) {
            const QString path = dir + u'/' + relativeFileName.mid(sizeof("lib/") - 1);
            if (QFile::exists(path))
                return path;
        }
    }

    for (const auto &prefix : options->extraPrefixDirs) {
        const QString path = prefix + u'/' + relativeFileName;
        if (QFile::exists(path))
            return path;
    }

    if (relativeFileName.endsWith("-android-dependencies.xml"_L1)) {
        for (const auto &dir : options->extraLibraryDirs) {
            const QString path = dir + u'/' + relativeFileName;
            if (QFile::exists(path))
                return path;
        }
        return options->qtInstallDirectory + u'/' + options->qtLibsDirectory +
               u'/' + relativeFileName;
    }

    if (relativeFileName.startsWith("jar/"_L1)) {
        return options->qtInstallDirectory + u'/' + options->qtDataDirectory +
               u'/' + relativeFileName;
    }

    if (relativeFileName.startsWith("lib/"_L1)) {
        return options->qtInstallDirectory + u'/' + options->qtLibsDirectory +
               u'/' + relativeFileName.mid(sizeof("lib/") - 1);
    }
    return options->qtInstallDirectory + u'/' + relativeFileName;
}